

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O0

DdNode * cuddUniqueConst(DdManager *unique,double value)

{
  DdNode **ppDVar1;
  uint uVar2;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  int local_40;
  int iStack_3c;
  hack split;
  DdNode *looking;
  DdNodePtr *nodelist;
  double dStack_20;
  int pos;
  double value_local;
  DdManager *unique_local;
  
  if ((unique->constants).maxKeys < (unique->constants).keys) {
    if ((unique->gcEnabled == 0) ||
       ((unique->dead <= unique->minDead &&
        ((unique->constants).dead * 10 <= (unique->constants).keys * 9)))) {
      cuddRehash(unique,0x7fffffff);
    }
    else {
      cuddGarbageCollect(unique,1);
    }
  }
  if (value < 1e+151) {
    local_50 = value;
    if (value <= -1e+151) {
      local_50 = -1e+302;
    }
    local_48 = local_50;
  }
  else {
    local_48 = 1e+302;
  }
  dStack_20 = local_48;
  if (0.0 <= local_48) {
    local_58 = local_48;
  }
  else {
    local_58 = -local_48;
  }
  if (local_58 < unique->epsilon) {
    dStack_20 = 0.0;
  }
  local_40 = SUB84(dStack_20,0);
  iStack_3c = (int)((ulong)dStack_20 >> 0x20);
  uVar2 = (uint)((local_40 * 0xc00005 + iStack_3c) * 0x40f1f9) >>
          ((byte)(unique->constants).shift & 0x1f);
  ppDVar1 = (unique->constants).nodelist;
  split = *(hack *)(ppDVar1 + (int)uVar2);
  while( true ) {
    if (split == (hack)0x0) {
      unique->keys = unique->keys + 1;
      (unique->constants).keys = (unique->constants).keys + 1;
      unique_local = (DdManager *)cuddAllocNode(unique);
      if (unique_local == (DdManager *)0x0) {
        unique_local = (DdManager *)0x0;
      }
      else {
        (unique_local->sentinel).index = 0x7fffffff;
        (unique_local->sentinel).type.value = dStack_20;
        (unique_local->sentinel).next = ppDVar1[(int)uVar2];
        ppDVar1[(int)uVar2] = (DdNode *)unique_local;
      }
      return &unique_local->sentinel;
    }
    if ((*(double *)((long)split + 0x10) == dStack_20) &&
       (!NAN(*(double *)((long)split + 0x10)) && !NAN(dStack_20))) break;
    if (0.0 <= *(double *)((long)split + 0x10) - dStack_20) {
      local_60 = *(double *)((long)split + 0x10) - dStack_20;
    }
    else {
      local_60 = -(*(double *)((long)split + 0x10) - dStack_20);
    }
    if (local_60 < unique->epsilon) break;
    split = *(hack *)((long)split + 8);
  }
  if (*(int *)((long)split + 4) == 0) {
    cuddReclaim(unique,(DdNode *)split);
  }
  return (DdNode *)split.value;
}

Assistant:

DdNode *
cuddUniqueConst(
  DdManager * unique,
  CUDD_VALUE_TYPE  value)
{
    int pos;
    DdNodePtr *nodelist;
    DdNode *looking;
    hack split;

#ifdef DD_UNIQUE_PROFILE
    unique->uniqueLookUps++;
#endif

    if (unique->constants.keys > unique->constants.maxKeys) {
        if (unique->gcEnabled && ((unique->dead > unique->minDead) ||
        (10 * unique->constants.dead > 9 * unique->constants.keys))) {  /* too many dead */
            (void) cuddGarbageCollect(unique,1);
        } else {
            cuddRehash(unique,CUDD_CONST_INDEX);
        }
    }

    cuddAdjust(value); /* for the case of crippled infinities */

    if (ddAbs(value) < unique->epsilon) {
        value = 0.0;
    }
    split.value = value;

    pos = ddHash(split.bits[0], split.bits[1], unique->constants.shift);
    nodelist = unique->constants.nodelist;
    looking = nodelist[pos];

    /* Here we compare values both for equality and for difference less
     * than epsilon. The first comparison is required when values are
     * infinite, since Infinity - Infinity is NaN and NaN < X is 0 for
     * every X.
     */
    while (looking != NULL) {
        if (looking->type.value == value ||
        ddEqualVal(looking->type.value,value,unique->epsilon)) {
            if (looking->ref == 0) {
                cuddReclaim(unique,looking);
            }
            return(looking);
        }
        looking = looking->next;
#ifdef DD_UNIQUE_PROFILE
        unique->uniqueLinks++;
#endif
    }

    unique->keys++;
    unique->constants.keys++;

    looking = cuddAllocNode(unique);
    if (looking == NULL) return(NULL);
    looking->index = CUDD_CONST_INDEX;
    looking->type.value = value;
    looking->next = nodelist[pos];
    nodelist[pos] = looking;

    return(looking);

}